

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Copy(Compiler *this,Frag arg)

{
  Frag FVar1;
  LogMessage LStack_188;
  
  LogMessage::LogMessage
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",0x326
             ,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&LStack_188.str_,"Compiler::Copy called!",0x16);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_188);
  this->failed_ = true;
  FVar1.begin = 0;
  FVar1.end.p = 0;
  return FVar1;
}

Assistant:

Frag Compiler::Copy(Frag arg) {
  // We're using WalkExponential; there should be no copying.
  LOG(DFATAL) << "Compiler::Copy called!";
  failed_ = true;
  return NoMatch();
}